

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_method.cc
# Opt level: O1

bool next_epoch(SSL *ssl,uint16_t *out,ssl_encryption_level_t level,uint16_t prev)

{
  uint16_t uVar1;
  
  if (level < ssl_encryption_application) {
    *out = (uint16_t)level;
  }
  else {
    if (level != ssl_encryption_application) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_method.cc"
                    ,0x43,
                    "bool next_epoch(const SSL *, uint16_t *, ssl_encryption_level_t, uint16_t)");
    }
    if ((prev < 3) && (uVar1 = bssl::ssl_protocol_version(ssl), 0x303 < uVar1)) {
      *out = 3;
    }
    else {
      if (prev == 0xffff) {
        ERR_put_error(0x10,0,0x104,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_method.cc"
                      ,0x3c);
        return false;
      }
      *out = prev + 1;
    }
  }
  return true;
}

Assistant:

static bool next_epoch(const SSL *ssl, uint16_t *out,
                       ssl_encryption_level_t level, uint16_t prev) {
  switch (level) {
    case ssl_encryption_initial:
    case ssl_encryption_early_data:
    case ssl_encryption_handshake:
      *out = static_cast<uint16_t>(level);
      return true;

    case ssl_encryption_application:
      if (prev < ssl_encryption_application &&
          ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
        *out = static_cast<uint16_t>(level);
        return true;
      }

      if (prev == 0xffff) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_KEY_UPDATES);
        return false;
      }
      *out = prev + 1;
      return true;
  }

  assert(0);
  return false;
}